

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapping.cpp
# Opt level: O0

void matrixFromStdVector(void)

{
  initializer_list<float> __l;
  float *pfVar1;
  ostream *poVar2;
  Stride<0,_0> local_9a;
  undefined1 local_98 [8];
  Map<Eigen::Matrix<float,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> einMatRowMajor;
  undefined1 local_80 [8];
  Map<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> einMatColMajor;
  allocator<float> local_59;
  float local_58 [10];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<float,_std::allocator<float>_> data;
  
  local_58[4] = 5.0;
  local_58[5] = 6.0;
  local_58[6] = 7.0;
  local_58[7] = 8.0;
  local_58[0] = 1.0;
  local_58[1] = 2.0;
  local_58[2] = 3.0;
  local_58[3] = 4.0;
  local_58[8] = 9.0;
  local_30 = local_58;
  local_28 = 9;
  std::allocator<float>::allocator(&local_59);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_20,__l,&local_59);
  std::allocator<float>::~allocator(&local_59);
  pfVar1 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)local_20);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)&einMatRowMajor.field_0xe);
  Eigen::Map<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_80,pfVar1,
             (Stride<0,_0> *)&einMatRowMajor.field_0xe);
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)local_20);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Map<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                              *)local_80);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pfVar1 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)local_20);
  Eigen::Stride<0,_0>::Stride(&local_9a);
  Eigen::Map<Eigen::Matrix<float,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<float,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_98,pfVar1,
             &local_9a);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Map<Eigen::Matrix<float,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                              *)local_98);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_20);
  return;
}

Assistant:

void matrixFromStdVector() {
  std::vector<float> data = {1, 2, 3, 4, 5, 6, 7, 8, 9};

  auto einMatColMajor = Eigen::Map<Eigen::Matrix<float, 3, 3>>(data.data());

  data.clear();
  std::cout << einMatColMajor << std::endl;

  auto einMatRowMajor =
      Eigen::Map<Eigen::Matrix<float, 3, 3, Eigen::RowMajor>>(data.data());

  std::cout << einMatRowMajor << std::endl;
}